

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward
          (Deconvolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int kernel_w;
  int kernel_h;
  uint _c;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Mat *bottom_blob;
  pointer pMVar9;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  void *pvVar14;
  Option *pOVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  void *pvVar19;
  int j;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  void *pvVar26;
  int k;
  ulong uVar27;
  undefined1 auVar28 [16];
  Option *opt_00;
  Mat local_178;
  pointer local_120;
  undefined1 local_118 [32];
  Allocator *local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  int local_e0;
  size_t local_d8;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = bottom_blob->c;
  kernel_w = bottom_blob[1].w;
  kernel_h = bottom_blob[1].h;
  _c = bottom_blob[1].d;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar20 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_00263b88;
  local_c8.cstep = 0;
  uVar18 = kernel_h * kernel_w;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_120 = pMVar9;
  Mat::create(&local_c8,uVar1 * _c * uVar18,4,opt->workspace_allocator);
  pMVar9 = local_120;
  iVar20 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    opt_00 = (Option *)&opt->workspace_allocator;
    uVar16 = 0;
    uVar17 = 0;
    if (0 < (int)uVar18) {
      uVar17 = (ulong)uVar18;
    }
    lVar23 = (long)(int)uVar18;
    uVar24 = 0;
    if (0 < (int)uVar1) {
      uVar24 = (ulong)uVar1;
    }
    uVar25 = 0;
    if (0 < (int)_c) {
      uVar25 = (ulong)_c;
    }
    pvVar14 = local_c8.data;
    pvVar22 = local_78.data;
    for (; uVar16 != uVar25; uVar16 = uVar16 + 1) {
      pvVar19 = pvVar14;
      pvVar26 = pvVar22;
      for (uVar21 = 0; uVar21 != uVar24; uVar21 = uVar21 + 1) {
        for (uVar27 = 0; uVar17 != uVar27; uVar27 = uVar27 + 1) {
          *(undefined4 *)((long)pvVar19 + uVar27 * 4) = *(undefined4 *)((long)pvVar26 + uVar27 * 4);
        }
        pvVar19 = (void *)((long)pvVar19 + lVar23 * 4);
        pvVar26 = (void *)((long)pvVar26 + (int)_c * lVar23 * 4);
      }
      pvVar14 = (void *)((long)pvVar14 + (int)uVar1 * lVar23 * 4);
      pvVar22 = (void *)((long)pvVar22 + lVar23 * 4);
    }
    local_d8 = 0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
    local_f8 = (Allocator *)0x0;
    iStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8._0_4_ = 0;
    uStack_e8._4_4_ = 0;
    local_e0 = 0;
    if (this->bias_term == 0) {
LAB_002638bb:
      iVar20 = this->dilation_w;
      iVar2 = bottom_blob->w;
      iVar3 = this->stride_w;
      iVar4 = bottom_blob->h;
      iVar5 = this->dilation_h;
      iVar6 = this->stride_h;
      iVar7 = this->output_pad_right;
      iVar8 = this->output_pad_bottom;
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize = 0;
      local_178.elempack = 0;
      local_178.allocator = (Allocator *)0x0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      auVar28._0_4_ = -(uint)(0 < this->pad_left);
      auVar28._4_4_ = -(uint)(0 < this->pad_right);
      auVar28._8_4_ = -(uint)(0 < this->pad_top);
      auVar28._12_4_ = -(uint)(0 < this->pad_bottom);
      iVar13 = movmskps(kernel_h,auVar28);
      pOVar15 = opt_00;
      if ((iVar13 == 0) && ((this->output_w < 1 || (this->output_h < 1)))) {
        if (&local_178 != pMVar9) {
          piVar10 = pMVar9->refcount;
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + 1;
            UNLOCK();
          }
          local_178.data = pMVar9->data;
          local_178.refcount._0_4_ = SUB84(pMVar9->refcount,0);
          local_178.refcount._4_4_ = (undefined4)((ulong)pMVar9->refcount >> 0x20);
          local_178.elemsize = pMVar9->elemsize;
          local_178.elempack = pMVar9->elempack;
          local_178.allocator = pMVar9->allocator;
          uVar11 = pMVar9->dims;
          uVar12 = pMVar9->w;
          local_178.h = pMVar9->h;
          local_178.d = pMVar9->d;
          local_178.c = pMVar9->c;
          local_178.cstep = pMVar9->cstep;
          local_178.dims = uVar11;
          local_178.w = uVar12;
        }
        pOVar15 = (Option *)&opt->blob_allocator;
      }
      Mat::create(&local_178,iVar7 + (kernel_w + -1) * iVar20 + (iVar2 + -1) * iVar3 + 1,
                  iVar8 + 1 + (kernel_h + -1) * iVar5 + (iVar4 + -1) * iVar6,_c,4,
                  *(Allocator **)pOVar15);
      if ((local_178.data == (void *)0x0) || ((long)local_178.c * local_178.cstep == 0)) {
LAB_00263aea:
        iVar20 = -100;
      }
      else {
        deconvolution(bottom_blob,&local_178,&local_c8,(Mat *)local_118,kernel_w,kernel_h,
                      this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                      this->activation_type,&this->activation_params,opt_00);
        pMVar9 = local_120;
        cut_padding(this,&local_178,local_120,opt);
        if ((pMVar9->data == (void *)0x0) || (iVar20 = 0, (long)pMVar9->c * pMVar9->cstep == 0))
        goto LAB_00263aea;
      }
      piVar10 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,(Mat *)local_118,opt);
      iVar20 = -100;
      if (((void *)local_118._0_8_ != (void *)0x0) && ((long)local_e0 * local_d8 != 0))
      goto LAB_002638bb;
    }
    piVar10 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_f8 == (Allocator *)0x0) {
          free((void *)local_118._0_8_);
        }
        else {
          (*local_f8->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00263b88:
  piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int Deconvolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}